

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O3

void aom_transpose_float_sse2(float *A,float *B,int n)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  int x;
  ulong uVar22;
  ulong uVar23;
  float *pfVar24;
  
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
    pfVar20 = A + (uint)(n * 3);
    pfVar21 = A + (uint)(n * 2);
    pfVar19 = A + uVar3;
    uVar23 = 0;
    do {
      uVar22 = 0;
      pfVar24 = B;
      do {
        pfVar1 = A + uVar22;
        fVar4 = pfVar1[1];
        fVar5 = pfVar1[2];
        fVar6 = pfVar1[3];
        pfVar2 = pfVar19 + uVar22;
        fVar7 = *pfVar2;
        fVar8 = pfVar2[1];
        fVar9 = pfVar2[2];
        fVar10 = pfVar2[3];
        pfVar2 = pfVar21 + uVar22;
        fVar11 = *pfVar2;
        fVar12 = pfVar2[1];
        fVar13 = pfVar2[2];
        fVar14 = pfVar2[3];
        pfVar2 = pfVar20 + uVar22;
        fVar15 = *pfVar2;
        fVar16 = pfVar2[1];
        fVar17 = pfVar2[2];
        fVar18 = pfVar2[3];
        *pfVar24 = *pfVar1;
        pfVar24[1] = fVar7;
        pfVar24[2] = fVar11;
        pfVar24[3] = fVar15;
        pfVar1 = pfVar24 + uVar3;
        *pfVar1 = fVar4;
        pfVar1[1] = fVar8;
        pfVar1[2] = fVar12;
        pfVar1[3] = fVar16;
        pfVar1 = pfVar24 + (uint)(n * 2);
        *pfVar1 = fVar5;
        pfVar1[1] = fVar9;
        pfVar1[2] = fVar13;
        pfVar1[3] = fVar17;
        pfVar1 = pfVar24 + (uint)(n * 3);
        *pfVar1 = fVar6;
        pfVar1[1] = fVar10;
        pfVar1[2] = fVar14;
        pfVar1[3] = fVar18;
        uVar22 = uVar22 + 4;
        pfVar24 = pfVar24 + uVar3 * 4;
      } while (uVar22 < uVar3);
      uVar23 = uVar23 + 4;
      B = B + 4;
      pfVar20 = pfVar20 + uVar3 * 4;
      pfVar21 = pfVar21 + uVar3 * 4;
      pfVar19 = pfVar19 + uVar3 * 4;
      A = A + uVar3 * 4;
    } while (uVar23 < uVar3);
  }
  return;
}

Assistant:

void aom_transpose_float_sse2(const float *A, float *B, int n) {
  for (int y = 0; y < n; y += 4) {
    for (int x = 0; x < n; x += 4) {
      transpose4x4(A + y * n + x, B + x * n + y, n, n);
    }
  }
}